

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5DecodeFunction(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  void *pvVar1;
  long lVar2;
  u32 uVar3;
  uint uVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  void *__src;
  ushort *puVar14;
  char *pcVar15;
  uint uVar16;
  u8 *p;
  long lVar17;
  Fts5Structure *pFVar18;
  Fts5Structure *pFVar19;
  Fts5Structure *pFVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  int rc;
  int nKeep;
  u64 iVal;
  int nIncr;
  int nAppend;
  int iTermOff;
  int local_c8;
  u32 local_c4;
  ushort *local_c0;
  Fts5Buffer local_b8;
  Fts5Structure *local_a8;
  Fts5Structure *local_a0;
  ulong local_98;
  int local_8c;
  Fts5DlidxLvl local_88;
  Fts5Structure *local_60;
  u32 local_58;
  u32 local_54;
  ulong local_50;
  sqlite3_context *local_48;
  ushort *local_40;
  uint local_38;
  
  local_c8 = 0;
  pvVar1 = pCtx->pFunc->pUserData;
  local_b8.p = (u8 *)0x0;
  local_b8.n = 0;
  local_b8.nSpace = 0;
  local_48 = pCtx;
  uVar13 = sqlite3VdbeIntValue(*apVal);
  uVar8 = sqlite3ValueBytes(apVal[1],'\x01');
  pFVar19 = (Fts5Structure *)(ulong)uVar8;
  __src = sqlite3_value_blob(apVal[1]);
  puVar14 = (ushort *)sqlite3Fts5MallocZero(&local_c8,(long)(int)(uVar8 + 8));
  iVar9 = local_c8;
  if (puVar14 == (ushort *)0x0) goto LAB_001d4d5e;
  if (0 < (int)uVar8) {
    memcpy(puVar14,__src,(size_t)pFVar19);
  }
  uVar24 = uVar13 >> 0x24;
  uVar21 = (uint)(uVar13 >> 0x25) & 0xffff;
  local_c0 = puVar14;
  if (uVar21 == 0) {
    if (uVar13 == 1) {
      sqlite3Fts5BufferAppendPrintf(&local_c8,&local_b8,"{averages} ");
      if ((uVar24 & 1) == 0) {
        iVar9 = local_c8;
        if (0 < (int)uVar8) {
          uVar21 = 0;
          pcVar15 = "";
          do {
            bVar5 = sqlite3Fts5GetVarint((uchar *)((ulong)uVar21 + (long)puVar14),(u64 *)&local_88);
            uVar21 = uVar21 + bVar5;
            sqlite3Fts5BufferAppendPrintf
                      (&local_c8,&local_b8,"%s%d",pcVar15,(ulong)local_88.pData & 0xffffffff);
            pcVar15 = " ";
            iVar9 = local_c8;
          } while ((int)uVar21 < (int)uVar8);
        }
        goto LAB_001d4d5e;
      }
    }
    else {
      sqlite3Fts5BufferAppendPrintf(&local_c8,&local_b8,"{structure}");
      if ((uVar24 & 1) == 0) {
        local_88.pData = (Fts5Data *)0x0;
        iVar9 = fts5StructureDecode((u8 *)puVar14,uVar8,(int *)0x0,(Fts5Structure **)&local_88);
        puVar14 = local_c0;
        if (iVar9 == 0) {
          local_a8 = (Fts5Structure *)local_88.pData;
          if (0 < *(int *)((long)local_88.pData + 0x14)) {
            local_a0 = (Fts5Structure *)((long)local_88.pData + 0x18);
            uVar13 = 0;
            do {
              pFVar19 = local_a0;
              local_98 = uVar13;
              sqlite3Fts5BufferAppendPrintf
                        (&local_c8,&local_b8," {lvl=%d nMerge=%d nSeg=%d",uVar13,
                         (ulong)*(uint *)&local_a0->aLevel[uVar13 - 2].aSeg,
                         (ulong)*(uint *)((long)&local_a0->aLevel[uVar13 - 2].aSeg + 4));
              pFVar20 = local_a0;
              if (0 < *(int *)((long)&pFVar19->aLevel[uVar13 - 2].aSeg + 4)) {
                lVar17 = 8;
                lVar25 = 0;
                do {
                  lVar2 = *(long *)(pFVar20->aLevel + (uVar13 - 1));
                  sqlite3Fts5BufferAppendPrintf
                            (&local_c8,&local_b8," {id=%d leaves=%d..%d}",
                             (ulong)*(uint *)(lVar2 + -8 + lVar17),
                             (ulong)*(uint *)(lVar2 + -4 + lVar17),(ulong)*(uint *)(lVar2 + lVar17))
                  ;
                  lVar25 = lVar25 + 1;
                  lVar17 = lVar17 + 0xc;
                } while (lVar25 < *(int *)((long)&pFVar20->aLevel[uVar13 - 2].aSeg + 4));
              }
              sqlite3Fts5BufferAppendPrintf(&local_c8,&local_b8,"}");
              uVar13 = local_98 + 1;
            } while ((long)uVar13 < (long)local_a8->nLevel);
          }
          fts5StructureRelease(local_a8);
          puVar14 = local_c0;
          iVar9 = local_c8;
        }
        goto LAB_001d4d5e;
      }
    }
  }
  else {
    pcVar15 = "dlidx ";
    if ((uVar13 >> 0x24 & 1) == 0) {
      pcVar15 = "";
    }
    sqlite3Fts5BufferAppendPrintf
              (&local_c8,&local_b8,"{%ssegid=%d h=%d pgno=%d}",pcVar15,(ulong)uVar21,
               (ulong)((uint)(uVar13 >> 0x1f) & 0x1f),(uint)uVar13 & 0x7fffffff);
    if ((uVar24 & 1) == 0) {
      if (pvVar1 == (void *)0x0) {
        local_40 = (ushort *)((ulong)local_40 & 0xffffffff00000000);
        local_88.pData = (Fts5Data *)0x0;
        local_88.iOff = 0;
        local_88.bEof = 0;
        if ((int)uVar8 < 4) {
          local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
          sqlite3Fts5BufferAppendBlob(&local_c8,&local_b8,7,(u8 *)"corrupt");
          puVar14 = local_c0;
          iVar9 = local_c8;
          goto LAB_001d4d5e;
        }
        uVar6 = *puVar14;
        uVar7 = puVar14[1] << 8 | puVar14[1] >> 8;
        if (uVar7 < uVar8) {
          sqlite3Fts5GetVarint32((uchar *)((long)puVar14 + (ulong)uVar7),(u32 *)&local_40);
          uVar21 = (uint)local_40;
          if ((uint)local_40 == 0) {
            uVar21 = (uint)uVar7;
          }
LAB_001d4ee7:
          puVar14 = local_c0;
          uVar6 = uVar6 << 8 | uVar6 >> 8;
          uVar23 = (uint)uVar6;
          if (uVar6 == 0) {
            uVar23 = uVar21;
          }
          if (((int)uVar23 <= (int)uVar8) &&
             (local_50 = (ulong)uVar7,
             fts5DecodePoslist(&local_c8,&local_b8,(u8 *)(local_c0 + 2),uVar23 - 4),
             (int)uVar21 <= (int)uVar8)) {
            fts5DecodeDoclist(&local_c8,&local_b8,(u8 *)((long)(int)uVar23 + (long)puVar14),
                              uVar21 - uVar23);
            local_60 = (Fts5Structure *)0x0;
            pFVar20 = local_60;
            if (((uint)local_50 < uVar8) && (local_a8 = pFVar19, local_c8 == 0)) {
              local_60 = (Fts5Structure *)0x0;
              local_8c = 0;
              pFVar18 = (Fts5Structure *)0x0;
              uVar13 = local_50;
              while( true ) {
                uVar24 = local_50;
                iVar9 = sqlite3Fts5GetVarint32
                                  ((uchar *)((uVar13 & 0xffffffff) + (long)local_c0),&local_c4);
                uVar8 = iVar9 + (int)uVar13;
                pFVar19 = (Fts5Structure *)((long)(int)pFVar18 + (long)(int)local_c4);
                iVar11 = (int)uVar24;
                iVar10 = (int)pFVar19;
                iVar9 = iVar11;
                if ((int)uVar8 < (int)local_a8) break;
LAB_001d4fdc:
                puVar14 = local_c0;
                local_98 = CONCAT44(local_98._4_4_,uVar8);
                if ((int)uVar13 != iVar11) {
                  iVar11 = sqlite3Fts5GetVarint32
                                     ((uchar *)((long)local_c0 + (long)(pFVar19->aLevel + -2) + 8),
                                      &local_c4);
                  if (local_8c < (int)local_c4) goto LAB_001d50bd;
                  iVar10 = iVar11 + iVar10;
                  local_88.iOff = local_c4;
                }
                local_a0 = pFVar19;
                iVar12 = sqlite3Fts5GetVarint32((uchar *)((long)puVar14 + (long)iVar10),&local_c4);
                iVar11 = iVar10 + iVar12 + local_c4;
                iVar22 = (int)local_a8;
                if (iVar22 < iVar11) goto LAB_001d50bd;
                sqlite3Fts5BufferAppendBlob
                          (&local_c8,(Fts5Buffer *)&local_88,local_c4,
                           (u8 *)((long)(iVar10 + iVar12) + (long)puVar14));
                local_8c = local_88.iOff;
                local_60 = (Fts5Structure *)local_88.pData;
                sqlite3Fts5BufferAppendPrintf(&local_c8,&local_b8," term=%.*s");
                fts5DecodeDoclist(&local_c8,&local_b8,(u8 *)((long)iVar11 + (long)puVar14),
                                  iVar9 - iVar11);
                pFVar20 = local_60;
                if ((iVar22 <= (int)local_98) ||
                   (pFVar18 = local_a0, uVar13 = local_98, local_c8 != 0)) goto LAB_001d4d54;
              }
              sqlite3Fts5GetVarint32((uchar *)((ulong)uVar8 + (long)local_c0),&local_c4);
              iVar9 = local_c4 + iVar10;
              if (iVar9 <= iVar11) goto LAB_001d4fdc;
LAB_001d50bd:
              local_c8 = 0x10b;
              pFVar20 = local_60;
            }
            goto LAB_001d4d54;
          }
        }
        else {
          uVar21 = (uint)uVar7;
          if (uVar7 <= uVar8) goto LAB_001d4ee7;
        }
        local_c8 = 0x10b;
        puVar14 = local_c0;
        iVar9 = local_c8;
        goto LAB_001d4d5e;
      }
      uVar6 = puVar14[1] << 8 | puVar14[1] >> 8;
      local_c4 = 0;
      local_88.pData = (Fts5Data *)0x0;
      local_88.iOff = 0;
      local_88.bEof = 0;
      uVar21 = (uint)uVar6;
      if ((int)(uint)uVar6 < (int)uVar8) {
        local_a8 = pFVar19;
        iVar9 = sqlite3Fts5GetVarint32((uchar *)((long)puVar14 + (ulong)uVar6),(u32 *)&local_40);
        uVar8 = (uint)local_40;
        fts5DecodeRowidList(&local_c8,&local_b8,(u8 *)(puVar14 + 2),(uint)local_40 - 4);
        puVar14 = local_c0;
        uVar23 = (uint)uVar6;
        if ((int)uVar23 <= (int)uVar8) goto LAB_001d4d46;
        local_98 = CONCAT44(local_98._4_4_,iVar9 + uVar23);
        uVar16 = uVar8;
        do {
          iVar10 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar8 + (long)puVar14),&local_54);
          uVar3 = local_54;
          local_88.iOff = local_c4;
          sqlite3Fts5BufferAppendBlob
                    (&local_c8,(Fts5Buffer *)&local_88,local_54,
                     (u8 *)((long)(int)(uVar8 + iVar10) + (long)puVar14));
          local_a0 = (Fts5Structure *)local_88.pData;
          sqlite3Fts5BufferAppendPrintf
                    (&local_c8,&local_b8," term=%.*s",local_88._8_8_ & 0xffffffff);
          iVar9 = (int)local_98;
          uVar4 = uVar21;
          if ((int)local_98 < (int)local_a8) {
            iVar11 = sqlite3Fts5GetVarint32
                               ((uchar *)((long)(int)local_98 + (long)puVar14),&local_58);
            local_98 = CONCAT44(local_98._4_4_,iVar9 + iVar11);
            uVar4 = uVar16 + local_58;
          }
          uVar16 = uVar4;
          iVar9 = uVar3 + uVar8 + iVar10;
          fts5DecodeRowidList(&local_c8,&local_b8,(u8 *)((long)iVar9 + (long)puVar14),uVar16 - iVar9
                             );
          uVar8 = uVar16;
          if ((int)uVar16 < (int)uVar23) {
            iVar9 = sqlite3Fts5GetVarint32((uchar *)((long)(int)uVar16 + (long)puVar14),&local_c4);
            uVar8 = iVar9 + uVar16;
          }
          pFVar20 = local_a0;
        } while ((int)uVar8 < (int)uVar21);
      }
      else {
        local_a8 = pFVar19;
        fts5DecodeRowidList(&local_c8,&local_b8,(u8 *)(puVar14 + 2),uVar21 - 4);
LAB_001d4d46:
        local_a0 = (Fts5Structure *)0x0;
        pFVar20 = local_a0;
      }
LAB_001d4d54:
      sqlite3_free(pFVar20);
      puVar14 = local_c0;
      iVar9 = local_c8;
      goto LAB_001d4d5e;
    }
  }
  local_88.pData = (Fts5Data *)&local_40;
  local_88.iOff = 0;
  local_88.bEof = 0;
  local_88.iRowid = 0;
  local_88._16_8_ = (uVar13 & 0x7fffffff) << 0x20;
  local_40 = puVar14;
  local_38 = uVar8;
  fts5DlidxLvlNext(&local_88);
  puVar14 = local_c0;
  iVar9 = local_c8;
  if (local_88.bEof == 0) {
    do {
      sqlite3Fts5BufferAppendPrintf
                (&local_c8,&local_b8," %d(%lld)",(ulong)local_88._16_8_ >> 0x20,local_88.iRowid);
      fts5DlidxLvlNext(&local_88);
      puVar14 = local_c0;
      iVar9 = local_c8;
    } while (local_88.bEof == 0);
  }
LAB_001d4d5e:
  local_c8 = iVar9;
  sqlite3_free(puVar14);
  p = local_b8.p;
  if (local_c8 == 0) {
    setResultStrOrError(local_48,(char *)local_b8.p,local_b8.n,'\x01',
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(local_48,local_c8);
    p = local_b8.p;
  }
  sqlite3_free(p);
  return;
}

Assistant:

static void fts5DecodeFunction(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args (always 2) */
  sqlite3_value **apVal           /* Function arguments */
){
  i64 iRowid;                     /* Rowid for record being decoded */
  int iSegid,iHeight,iPgno,bDlidx;/* Rowid components */
  const u8 *aBlob; int n;         /* Record to decode */
  u8 *a = 0;
  Fts5Buffer s;                   /* Build up text to return here */
  int rc = SQLITE_OK;             /* Return code */
  sqlite3_int64 nSpace = 0;
  int eDetailNone = (sqlite3_user_data(pCtx)!=0);

  assert( nArg==2 );
  UNUSED_PARAM(nArg);
  memset(&s, 0, sizeof(Fts5Buffer));
  iRowid = sqlite3_value_int64(apVal[0]);

  /* Make a copy of the second argument (a blob) in aBlob[]. The aBlob[]
  ** copy is followed by FTS5_DATA_ZERO_PADDING 0x00 bytes, which prevents
  ** buffer overreads even if the record is corrupt.  */
  n = sqlite3_value_bytes(apVal[1]);
  aBlob = sqlite3_value_blob(apVal[1]);
  nSpace = n + FTS5_DATA_ZERO_PADDING;
  a = (u8*)sqlite3Fts5MallocZero(&rc, nSpace);
  if( a==0 ) goto decode_out;
  if( n>0 ) memcpy(a, aBlob, n);

  fts5DecodeRowid(iRowid, &iSegid, &bDlidx, &iHeight, &iPgno);

  fts5DebugRowid(&rc, &s, iRowid);
  if( bDlidx ){
    Fts5Data dlidx;
    Fts5DlidxLvl lvl;

    dlidx.p = a;
    dlidx.nn = n;

    memset(&lvl, 0, sizeof(Fts5DlidxLvl));
    lvl.pData = &dlidx;
    lvl.iLeafPgno = iPgno;

    for(fts5DlidxLvlNext(&lvl); lvl.bEof==0; fts5DlidxLvlNext(&lvl)){
      sqlite3Fts5BufferAppendPrintf(&rc, &s, 
          " %d(%lld)", lvl.iLeafPgno, lvl.iRowid
      );
    }
  }else if( iSegid==0 ){
    if( iRowid==FTS5_AVERAGES_ROWID ){
      fts5DecodeAverages(&rc, &s, a, n);
    }else{
      fts5DecodeStructure(&rc, &s, a, n);
    }
  }else if( eDetailNone ){
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;
    int iPgidxOff = szLeaf = fts5GetU16(&a[2]);
    int iTermOff;
    int nKeep = 0;
    int iOff;

    memset(&term, 0, sizeof(Fts5Buffer));

    /* Decode any entries that occur before the first term. */
    if( szLeaf<n ){
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], iTermOff);
    }else{
      iTermOff = szLeaf;
    }
    fts5DecodeRowidList(&rc, &s, &a[4], iTermOff-4);

    iOff = iTermOff;
    while( iOff<szLeaf ){
      int nAppend;

      /* Read the term data for the next term*/
      iOff += fts5GetVarint32(&a[iOff], nAppend);
      term.n = nKeep;
      fts5BufferAppendBlob(&rc, &term, nAppend, &a[iOff]);
      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += nAppend;

      /* Figure out where the doclist for this term ends */
      if( iPgidxOff<n ){
        int nIncr;
        iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nIncr);
        iTermOff += nIncr;
      }else{
        iTermOff = szLeaf;
      }

      fts5DecodeRowidList(&rc, &s, &a[iOff], iTermOff-iOff);
      iOff = iTermOff;
      if( iOff<szLeaf ){
        iOff += fts5GetVarint32(&a[iOff], nKeep);
      }
    }

    fts5BufferFree(&term);
  }else{
    Fts5Buffer term;              /* Current term read from page */
    int szLeaf;                   /* Offset of pgidx in a[] */
    int iPgidxOff;
    int iPgidxPrev = 0;           /* Previous value read from pgidx */
    int iTermOff = 0;
    int iRowidOff = 0;
    int iOff;
    int nDoclist;

    memset(&term, 0, sizeof(Fts5Buffer));

    if( n<4 ){
      sqlite3Fts5BufferSet(&rc, &s, 7, (const u8*)"corrupt");
      goto decode_out;
    }else{
      iRowidOff = fts5GetU16(&a[0]);
      iPgidxOff = szLeaf = fts5GetU16(&a[2]);
      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], iTermOff);
      }else if( iPgidxOff>n ){
        rc = FTS5_CORRUPT;
        goto decode_out;
      }
    }

    /* Decode the position list tail at the start of the page */
    if( iRowidOff!=0 ){
      iOff = iRowidOff;
    }else if( iTermOff!=0 ){
      iOff = iTermOff;
    }else{
      iOff = szLeaf;
    }
    if( iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodePoslist(&rc, &s, &a[4], iOff-4);

    /* Decode any more doclist data that appears on the page before the
    ** first term. */
    nDoclist = (iTermOff ? iTermOff : szLeaf) - iOff;
    if( nDoclist+iOff>n ){
      rc = FTS5_CORRUPT;
      goto decode_out;
    }
    fts5DecodeDoclist(&rc, &s, &a[iOff], nDoclist);

    while( iPgidxOff<n && rc==SQLITE_OK ){
      int bFirst = (iPgidxOff==szLeaf);     /* True for first term on page */
      int nByte;                            /* Bytes of data */
      int iEnd;
      
      iPgidxOff += fts5GetVarint32(&a[iPgidxOff], nByte);
      iPgidxPrev += nByte;
      iOff = iPgidxPrev;

      if( iPgidxOff<n ){
        fts5GetVarint32(&a[iPgidxOff], nByte);
        iEnd = iPgidxPrev + nByte;
      }else{
        iEnd = szLeaf;
      }
      if( iEnd>szLeaf ){
        rc = FTS5_CORRUPT;
        break;
      }

      if( bFirst==0 ){
        iOff += fts5GetVarint32(&a[iOff], nByte);
        if( nByte>term.n ){
          rc = FTS5_CORRUPT;
          break;
        }
        term.n = nByte;
      }
      iOff += fts5GetVarint32(&a[iOff], nByte);
      if( iOff+nByte>n ){
        rc = FTS5_CORRUPT;
        break;
      }
      fts5BufferAppendBlob(&rc, &term, nByte, &a[iOff]);
      iOff += nByte;

      sqlite3Fts5BufferAppendPrintf(
          &rc, &s, " term=%.*s", term.n, (const char*)term.p
      );
      iOff += fts5DecodeDoclist(&rc, &s, &a[iOff], iEnd-iOff);
    }

    fts5BufferFree(&term);
  }
  
 decode_out:
  sqlite3_free(a);
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)s.p, s.n, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  fts5BufferFree(&s);
}